

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  code *pcVar1;
  undefined8 uVar2;
  uint16_t uVar3;
  uint8_t *puVar4;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *p;
  ptls_iovec_t pVar9;
  undefined8 local_238;
  char *server_name;
  size_t local_228;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  st_ptls_extension_bitmap_t bitmap;
  uint8_t *puStack_1c0;
  uint16_t type;
  uint8_t *local_1b8;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  ulong uStack_130;
  int ret;
  size_t num_certs;
  ptls_iovec_t certs [16];
  int *got_certs_local;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_t *tls_local;
  
  _block_size = 1;
  if (end == src) {
    _capacity._4_4_ = 0x32;
  }
  else {
    _block_size64 = 0;
    end_local = src;
    do {
      puVar6 = end_local + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*end_local;
      _block_size = _block_size - 1;
      end_local = puVar6;
    } while (_block_size != 0);
    if ((ulong)((long)end - (long)puVar6) < _block_size64) {
      _capacity._4_4_ = 0x32;
    }
    else if (puVar6 == puVar6 + _block_size64) {
      if (puVar6 == puVar6 + _block_size64) {
        _block_size_1 = 3;
        if ((ulong)((long)end - (long)puVar6) < 3) {
          _capacity._4_4_ = 0x32;
        }
        else {
          _block_size64_1 = 0;
          do {
            puVar6 = end_local + 1;
            _block_size64_1 = _block_size64_1 << 8 | (ulong)*end_local;
            _block_size_1 = _block_size_1 - 1;
            end_local = puVar6;
          } while (_block_size_1 != 0);
          uStack_130 = 0;
          _capacity._4_4_ = 0;
          if ((ulong)((long)end - (long)puVar6) < _block_size64_1) {
            _capacity._4_4_ = 0x32;
          }
          else {
            puVar6 = puVar6 + _block_size64_1;
            certs[0xf].len = (size_t)got_certs;
            src_local = (uint8_t *)tls;
            do {
              if (end_local == puVar6) {
                if (end_local != puVar6) {
                  return 0x32;
                }
                if (end_local == end) {
                  if (*(long *)(*(long *)src_local + 0x98) != 0) {
                    local_238 = 0;
                    iVar5 = ptls_is_server((ptls_t *)src_local);
                    if (iVar5 == 0) {
                      if (((src_local[0x178] & 1) == 0) ||
                         (iVar5 = ptls_is_ech_handshake
                                            ((ptls_t *)src_local,(uint8_t *)0x0,
                                             (ptls_hpke_kem_t **)0x0,
                                             (ptls_hpke_cipher_suite_t **)0x0), iVar5 != 0)) {
                        local_238 = *(undefined8 *)(src_local + 0x128);
                      }
                      else {
                        local_238 = *(undefined8 *)(src_local + 0x1d0);
                      }
                    }
                    _capacity._4_4_ =
                         (*(code *)**(undefined8 **)(*(long *)src_local + 0x98))
                                   (*(undefined8 *)(*(long *)src_local + 0x98),src_local,local_238,
                                    src_local + 0x298,src_local + 0x2a0,&num_certs,uStack_130);
                    if (_capacity._4_4_ != 0) {
                      return _capacity._4_4_;
                    }
                  }
                  *(uint *)certs[0xf].len = (uint)(uStack_130 != 0);
                  return _capacity._4_4_;
                }
                return 0x32;
              }
              _block_size_2 = 3;
              if ((ulong)((long)puVar6 - (long)end_local) < 3) {
                return 0x32;
              }
              _block_size64_2 = 0;
              do {
                puVar7 = end_local + 1;
                _block_size64_2 = _block_size64_2 << 8 | (ulong)*end_local;
                _block_size_2 = _block_size_2 - 1;
                end_local = puVar7;
              } while (_block_size_2 != 0);
              if ((ulong)((long)puVar6 - (long)puVar7) < _block_size64_2) {
                return 0x32;
              }
              if (uStack_130 < 0x10) {
                pVar9 = ptls_iovec_init(puVar7,(long)(puVar7 + _block_size64_2) - (long)puVar7);
                puStack_1c0 = pVar9.base;
                certs[uStack_130 - 1].len = (size_t)puStack_1c0;
                local_1b8 = (uint8_t *)pVar9.len;
                certs[uStack_130].base = local_1b8;
                uStack_130 = uStack_130 + 1;
              }
              end_local = puVar7 + _block_size64_2;
              memset(&_capacity_3,0,8);
              _block_size_3 = 2;
              if ((ulong)((long)puVar6 - (long)end_local) < 2) {
                return 0x32;
              }
              _block_size64_3 = 0;
              do {
                puVar7 = end_local + 1;
                _block_size64_3 = _block_size64_3 << 8 | (ulong)*end_local;
                _block_size_3 = _block_size_3 - 1;
                end_local = puVar7;
              } while (_block_size_3 != 0);
              if ((ulong)((long)puVar6 - (long)puVar7) < _block_size64_3) {
                return 0x32;
              }
              puVar7 = puVar7 + _block_size64_3;
              while (end_local != puVar7) {
                iVar5 = ptls_decode16((uint16_t *)((long)&bitmap.bits + 6),&end_local,puVar7);
                if (iVar5 != 0) {
                  return iVar5;
                }
                iVar5 = extension_bitmap_testandset
                                  ((st_ptls_extension_bitmap_t *)&_capacity_3,0xb,bitmap.bits._6_2_)
                ;
                puVar4 = src_local;
                uVar3 = bitmap.bits._6_2_;
                if (iVar5 == 0) {
                  return 0x2f;
                }
                _block_size_4 = 2;
                if ((ulong)((long)puVar7 - (long)end_local) < 2) {
                  return 0x32;
                }
                _block_size64_4 = 0;
                do {
                  p = end_local + 1;
                  _block_size64_4 = _block_size64_4 << 8 | (ulong)*end_local;
                  _block_size_4 = _block_size_4 - 1;
                  end_local = p;
                } while (_block_size_4 != 0);
                if ((ulong)((long)puVar7 - (long)p) < _block_size64_4) {
                  return 0x32;
                }
                puVar8 = p + _block_size64_4;
                _capacity._4_4_ = 0;
                end_local = puVar8;
                if (*(long *)(*(long *)src_local + 0xf0) != 0) {
                  pcVar1 = (code *)**(undefined8 **)(*(long *)src_local + 0xf0);
                  uVar2 = *(undefined8 *)(*(long *)src_local + 0xf0);
                  end_local = p;
                  pVar9 = ptls_iovec_init(p,(long)puVar8 - (long)p);
                  server_name = (char *)pVar9.base;
                  local_228 = pVar9.len;
                  iVar5 = (*pcVar1)(uVar2,puVar4,0xb,uVar3,server_name,local_228);
                  _capacity._4_4_ = (uint)(iVar5 != 0);
                  end_local = puVar8;
                  if (iVar5 != 0) {
                    return _capacity._4_4_;
                  }
                }
              }
            } while (end_local == puVar7);
            _capacity._4_4_ = 0x32;
          }
        }
      }
      else {
        _capacity._4_4_ = 0x32;
      }
    }
    else {
      _capacity._4_4_ = 0x2f;
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < PTLS_ELEMENTSOF(certs))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (tls->ctx->verify_certificate != NULL) {
        const char *server_name = NULL;
        if (!ptls_is_server(tls)) {
            if (tls->ech.offered && !ptls_is_ech_handshake(tls, NULL, NULL, NULL)) {
                server_name = tls->ech.client.public_name;
            } else {
                server_name = tls->server_name;
            }
        }
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, server_name, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}